

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

bool __thiscall IntView<3>::remVal(IntView<3> *this,int64_t v,Reason r,bool channel)

{
  byte bVar1;
  byte in_CL;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  bool local_1;
  
  if (in_RSI % (long)*(int *)(in_RDI + 1) == 0) {
    bVar1 = (**(code **)(*(long *)*in_RDI + 0x88))
                      ((long *)*in_RDI,-(in_RSI / (long)*(int *)(in_RDI + 1)),in_RDX,in_CL & 1);
    local_1 = (bool)(bVar1 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool remVal(int64_t v, Reason r = nullptr, bool channel = true) const {
		if ((type & 4) != 0) {
			v -= b;
		}
		if ((type & 2) != 0) {
			if ((v % a) != 0) {
				return true;
			}
			v = v / a;
		}
		if ((type & 1) != 0) {
			v = -v;
		}
		return var->remVal(v, r, channel);
	}